

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_8x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  int8_t *piVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000009;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  __m128i round;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i out [32];
  __m128i in [32];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  int iStack_410;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  undefined8 local_3d8;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  undefined8 local_358;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  int iStack_290;
  int iStack_28c;
  undefined1 local_288 [16];
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  int iStack_250;
  int iStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  piVar4 = av1_fwd_txfm_shift_ls[7];
  iVar8 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar10 = iVar8 - 4;
  uVar6 = (ulong)(uint)(iVar8 << 3);
  pcVar2 = *(code **)((long)col_highbd_txfm8x16_arr + uVar6);
  iVar8 = 0;
  iVar9 = 0;
  if ((byte)uVar10 < 0xc) {
    uVar10 = (uVar10 & 0xff) << 2;
    iVar8 = *(int *)(&DAT_0056a088 + uVar10);
    iVar9 = *(int *)(&DAT_0056a0b8 + uVar10);
  }
  pcVar3 = *(code **)((long)row_highbd_txfm8x8_arr + uVar6);
  load_buffer_8x16(input,(__m128i *)&local_238,stride,iVar8,iVar9,(int)*av1_fwd_txfm_shift_ls[7]);
  (*pcVar2)((__m128i *)&local_238,(__m128i *)&local_238,0xd,2);
  bVar1 = piVar4[1];
  iVar8 = 1 << (~bVar1 & 0x1f);
  auVar13 = ZEXT416((uint)-(int)(char)bVar1);
  local_238 = local_238 + iVar8 >> auVar13;
  iStack_410 = iStack_234 + iVar8 >> auVar13;
  iStack_230 = iStack_230 + iVar8 >> auVar13;
  iStack_3d0 = iStack_22c + iVar8 >> auVar13;
  local_228 = local_228 + iVar8 >> auVar13;
  iStack_390 = iStack_224 + iVar8 >> auVar13;
  iStack_220 = iStack_220 + iVar8 >> auVar13;
  iStack_350 = iStack_21c + iVar8 >> auVar13;
  local_218 = local_218 + iVar8 >> auVar13;
  iStack_40c = iStack_214 + iVar8 >> auVar13;
  iStack_210 = iStack_210 + iVar8 >> auVar13;
  iStack_3cc = iStack_20c + iVar8 >> auVar13;
  local_208 = local_208 + iVar8 >> auVar13;
  iStack_38c = iStack_204 + iVar8 >> auVar13;
  iStack_200 = iStack_200 + iVar8 >> auVar13;
  iStack_34c = iStack_1fc + iVar8 >> auVar13;
  local_1f8 = local_1f8 + iVar8 >> auVar13;
  local_408 = iStack_1f4 + iVar8 >> auVar13;
  iStack_3f0 = iStack_1f0 + iVar8 >> auVar13;
  local_3c8 = iStack_1ec + iVar8 >> auVar13;
  local_1e8 = local_1e8 + iVar8 >> auVar13;
  local_388 = iStack_1e4 + iVar8 >> auVar13;
  iStack_370 = iStack_1e0 + iVar8 >> auVar13;
  local_348 = iStack_1dc + iVar8 >> auVar13;
  local_1d8 = local_1d8 + iVar8 >> auVar13;
  iStack_404 = iStack_1d4 + iVar8 >> auVar13;
  iStack_3ec = iStack_1d0 + iVar8 >> auVar13;
  iStack_3c4 = iStack_1cc + iVar8 >> auVar13;
  local_1c8 = local_1c8 + iVar8 >> auVar13;
  iStack_384 = iStack_1c4 + iVar8 >> auVar13;
  iStack_36c = iStack_1c0 + iVar8 >> auVar13;
  iStack_344 = iStack_1bc + iVar8 >> auVar13;
  local_1b8 = local_1b8 + iVar8 >> auVar13;
  iStack_400 = iStack_1b4 + iVar8 >> auVar13;
  local_3e8 = iStack_1b0 + iVar8 >> auVar13;
  iStack_3c0 = iStack_1ac + iVar8 >> auVar13;
  local_1a8 = local_1a8 + iVar8 >> auVar13;
  iStack_380 = iStack_1a4 + iVar8 >> auVar13;
  local_368 = iStack_1a0 + iVar8 >> auVar13;
  iStack_340 = iStack_19c + iVar8 >> auVar13;
  local_198 = local_198 + iVar8 >> auVar13;
  iStack_3fc = iStack_194 + iVar8 >> auVar13;
  iStack_3e4 = iStack_190 + iVar8 >> auVar13;
  iStack_3bc = iStack_18c + iVar8 >> auVar13;
  local_188 = local_188 + iVar8 >> auVar13;
  iStack_37c = iStack_184 + iVar8 >> auVar13;
  iStack_364 = iStack_180 + iVar8 >> auVar13;
  iStack_33c = iStack_17c + iVar8 >> auVar13;
  local_178 = local_178 + iVar8 >> auVar13;
  local_3f8 = iStack_174 + iVar8 >> auVar13;
  iStack_3e0 = iStack_170 + iVar8 >> auVar13;
  iStack_16c = iStack_16c + iVar8 >> auVar13;
  local_168 = local_168 + iVar8 >> auVar13;
  local_378 = iStack_164 + iVar8 >> auVar13;
  iStack_360 = iStack_160 + iVar8 >> auVar13;
  iStack_15c = iStack_15c + iVar8 >> auVar13;
  local_158 = local_158 + iVar8 >> auVar13;
  iStack_3f4 = iStack_154 + iVar8 >> auVar13;
  iStack_3dc = iStack_150 + iVar8 >> auVar13;
  iStack_14c = iStack_14c + iVar8 >> auVar13;
  local_148 = local_148 + iVar8 >> auVar13;
  iStack_374 = iStack_144 + iVar8 >> auVar13;
  iStack_35c = iStack_140 + iVar8 >> auVar13;
  iStack_13c = iStack_13c + iVar8 >> auVar13;
  local_138 = local_138 + iVar8 >> auVar13;
  iStack_310 = iStack_134 + iVar8 >> auVar13;
  iStack_130 = iStack_130 + iVar8 >> auVar13;
  iStack_2d0 = iStack_12c + iVar8 >> auVar13;
  local_128 = local_128 + iVar8 >> auVar13;
  iStack_290 = iStack_124 + iVar8 >> auVar13;
  local_278 = iStack_120 + iVar8 >> auVar13;
  iStack_250 = iStack_11c + iVar8 >> auVar13;
  local_118 = local_118 + iVar8 >> auVar13;
  iStack_30c = iStack_114 + iVar8 >> auVar13;
  iStack_110 = iStack_110 + iVar8 >> auVar13;
  iStack_2cc = iStack_10c + iVar8 >> auVar13;
  local_108 = local_108 + iVar8 >> auVar13;
  iStack_28c = iStack_104 + iVar8 >> auVar13;
  iStack_274 = iStack_100 + iVar8 >> auVar13;
  iStack_24c = iStack_fc + iVar8 >> auVar13;
  local_f8 = local_f8 + iVar8 >> auVar13;
  local_308 = iStack_f4 + iVar8 >> auVar13;
  iStack_2f0 = iStack_f0 + iVar8 >> auVar13;
  local_2c8 = iStack_ec + iVar8 >> auVar13;
  local_e8 = local_e8 + iVar8 >> auVar13;
  iStack_e4 = iStack_e4 + iVar8 >> auVar13;
  iStack_270 = iStack_e0 + iVar8 >> auVar13;
  iStack_dc = iStack_dc + iVar8 >> auVar13;
  local_d8 = local_d8 + iVar8 >> auVar13;
  iStack_304 = iStack_d4 + iVar8 >> auVar13;
  iStack_2ec = iStack_d0 + iVar8 >> auVar13;
  iStack_2c4 = iStack_cc + iVar8 >> auVar13;
  local_c8 = local_c8 + iVar8 >> auVar13;
  iStack_c4 = iStack_c4 + iVar8 >> auVar13;
  iStack_26c = iStack_c0 + iVar8 >> auVar13;
  iStack_bc = iStack_bc + iVar8 >> auVar13;
  local_b8 = local_b8 + iVar8 >> auVar13;
  iStack_300 = iStack_b4 + iVar8 >> auVar13;
  local_2e8 = iStack_b0 + iVar8 >> auVar13;
  iStack_2c0 = iStack_ac + iVar8 >> auVar13;
  local_a8 = local_a8 + iVar8 >> auVar13;
  iStack_a4 = iStack_a4 + iVar8 >> auVar13;
  iStack_a0 = iStack_a0 + iVar8 >> auVar13;
  iStack_9c = iStack_9c + iVar8 >> auVar13;
  local_98 = local_98 + iVar8 >> auVar13;
  iStack_2fc = iStack_94 + iVar8 >> auVar13;
  iStack_2e4 = iStack_90 + iVar8 >> auVar13;
  iStack_2bc = iStack_8c + iVar8 >> auVar13;
  local_88 = local_88 + iVar8 >> auVar13;
  iStack_84 = iStack_84 + iVar8 >> auVar13;
  iStack_80 = iStack_80 + iVar8 >> auVar13;
  iStack_7c = iStack_7c + iVar8 >> auVar13;
  local_78 = local_78 + iVar8 >> auVar13;
  local_2f8 = iStack_74 + iVar8 >> auVar13;
  iStack_2e0 = iStack_70 + iVar8 >> auVar13;
  iStack_6c = iStack_6c + iVar8 >> auVar13;
  local_68 = local_68 + iVar8 >> auVar13;
  iStack_64 = iStack_64 + iVar8 >> auVar13;
  iStack_60 = iStack_60 + iVar8 >> auVar13;
  iStack_5c = iStack_5c + iVar8 >> auVar13;
  local_58 = local_58 + iVar8 >> auVar13;
  iStack_2f4 = iStack_54 + iVar8 >> auVar13;
  iStack_2dc = iStack_50 + iVar8 >> auVar13;
  iStack_4c = iStack_4c + iVar8 >> auVar13;
  local_48 = iVar8 + local_48 >> auVar13;
  iStack_44 = iVar8 + iStack_44 >> auVar13;
  iStack_40 = iVar8 + iStack_40 >> auVar13;
  iStack_3c = iVar8 + iStack_3c >> auVar13;
  uStack_430 = CONCAT44(local_1d8,local_1f8);
  local_438 = CONCAT44(local_218,local_238);
  uStack_3b0 = CONCAT44(local_1c8,local_1e8);
  uStack_420 = CONCAT44(local_158,local_178);
  local_428 = CONCAT44(local_198,local_1b8);
  local_3b8 = CONCAT44(iStack_14c,iStack_16c);
  uStack_3a0 = CONCAT44(local_148,local_168);
  local_3a8 = CONCAT44(local_188,local_1a8);
  local_338 = CONCAT44(local_118,local_138);
  uStack_330 = CONCAT44(local_d8,local_f8);
  uStack_2b0 = CONCAT44(local_c8,local_e8);
  local_328 = CONCAT44(local_98,local_b8);
  uStack_320 = CONCAT44(local_58,local_78);
  _local_2b8 = CONCAT44(iStack_4c,iStack_6c);
  auVar19._4_4_ = iStack_a4;
  auVar19._0_4_ = local_a8;
  auVar15._4_4_ = iStack_64;
  auVar15._0_4_ = local_68;
  auVar19._8_4_ = iStack_a4;
  auVar19._12_4_ = iStack_84;
  auVar18._4_4_ = local_88;
  auVar18._0_4_ = local_a8;
  auVar13._0_8_ = CONCAT44(iStack_80,iStack_a0);
  auVar13._8_4_ = iStack_9c;
  auVar13._12_4_ = iStack_7c;
  auVar15._8_4_ = iStack_64;
  auVar15._12_4_ = iStack_44;
  auVar18._12_4_ = local_48;
  auVar18._8_4_ = local_68;
  auVar17._0_8_ = CONCAT44(iStack_40,iStack_60);
  auVar17._8_4_ = iStack_5c;
  auVar17._12_4_ = iStack_3c;
  auVar20._8_8_ = auVar15._8_8_;
  auVar20._0_8_ = auVar19._8_8_;
  local_248 = auVar13._8_8_;
  uStack_240 = auVar17._8_8_;
  lVar11 = 0;
  bVar5 = true;
  local_2a8 = auVar18;
  local_288 = auVar20;
  local_268 = auVar13._0_8_;
  uStack_260 = auVar17._0_8_;
  iStack_234 = iStack_410;
  iStack_22c = iStack_3d0;
  iStack_224 = iStack_390;
  iStack_21c = iStack_350;
  iStack_214 = iStack_40c;
  iStack_20c = iStack_3cc;
  iStack_204 = iStack_38c;
  iStack_1fc = iStack_34c;
  iStack_1f4 = local_408;
  iStack_1f0 = iStack_3f0;
  iStack_1ec = local_3c8;
  iStack_1e4 = local_388;
  iStack_1e0 = iStack_370;
  iStack_1dc = local_348;
  iStack_1d4 = iStack_404;
  iStack_1d0 = iStack_3ec;
  iStack_1cc = iStack_3c4;
  iStack_1c4 = iStack_384;
  iStack_1c0 = iStack_36c;
  iStack_1bc = iStack_344;
  iStack_1b4 = iStack_400;
  iStack_1b0 = local_3e8;
  iStack_1ac = iStack_3c0;
  iStack_1a4 = iStack_380;
  iStack_1a0 = local_368;
  iStack_19c = iStack_340;
  iStack_194 = iStack_3fc;
  iStack_190 = iStack_3e4;
  iStack_18c = iStack_3bc;
  iStack_184 = iStack_37c;
  iStack_180 = iStack_364;
  iStack_17c = iStack_33c;
  iStack_174 = local_3f8;
  iStack_170 = iStack_3e0;
  iStack_164 = local_378;
  iStack_160 = iStack_360;
  iStack_154 = iStack_3f4;
  iStack_150 = iStack_3dc;
  iStack_144 = iStack_374;
  iStack_140 = iStack_35c;
  iStack_134 = iStack_310;
  iStack_12c = iStack_2d0;
  iStack_124 = iStack_290;
  iStack_120 = local_278;
  iStack_11c = iStack_250;
  iStack_114 = iStack_30c;
  iStack_10c = iStack_2cc;
  iStack_104 = iStack_28c;
  iStack_100 = iStack_274;
  iStack_fc = iStack_24c;
  iStack_f4 = local_308;
  iStack_f0 = iStack_2f0;
  iStack_ec = local_2c8;
  iStack_e0 = iStack_270;
  iStack_d4 = iStack_304;
  iStack_d0 = iStack_2ec;
  iStack_cc = iStack_2c4;
  iStack_c0 = iStack_26c;
  iStack_b4 = iStack_300;
  iStack_b0 = local_2e8;
  iStack_ac = iStack_2c0;
  iStack_94 = iStack_2fc;
  iStack_90 = iStack_2e4;
  iStack_8c = iStack_2bc;
  iStack_74 = local_2f8;
  iStack_70 = iStack_2e0;
  iStack_54 = iStack_2f4;
  iStack_50 = iStack_2dc;
  do {
    bVar12 = bVar5;
    (*pcVar3)(&local_438 + lVar11 * 0x20,&local_438,0xd,2);
    bVar1 = piVar4[2];
    iVar8 = (int)(char)bVar1;
    if (iVar8 < 0) {
      iVar9 = 1 << (~bVar1 & 0x1f);
      lVar7 = 0;
      auVar18 = pmovsxwd(auVar18,0x16a116a116a116a1);
      auVar20 = pmovsxwd(auVar20,0x800080008000800);
      do {
        auVar17 = ZEXT416((uint)-iVar8);
        auVar16._0_4_ = *(int *)((long)&local_438 + lVar7) + iVar9 >> auVar17;
        auVar16._4_4_ = *(int *)((long)&local_438 + lVar7 + 4) + iVar9 >> auVar17;
        auVar16._8_4_ = *(int *)((long)&uStack_430 + lVar7) + iVar9 >> auVar17;
        auVar16._12_4_ = *(int *)((long)&uStack_430 + lVar7 + 4) + iVar9 >> auVar17;
        auVar13 = pmulld(auVar16,auVar18);
        *(int *)((long)&local_438 + lVar7) = auVar13._0_4_ + auVar20._0_4_ >> 0xc;
        *(int *)((long)&local_438 + lVar7 + 4) = auVar13._4_4_ + auVar20._4_4_ >> 0xc;
        *(int *)((long)&uStack_430 + lVar7) = auVar13._8_4_ + auVar20._8_4_ >> 0xc;
        *(int *)((long)&uStack_430 + lVar7 + 4) = auVar13._12_4_ + auVar20._12_4_ >> 0xc;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x100);
    }
    else {
      lVar7 = 0;
      auVar17 = pmovsxwd(auVar17,0x16a116a116a116a1);
      auVar18 = pmovsxwd(auVar18,0x800080008000800);
      do {
        auVar14._0_4_ = *(int *)((long)&local_438 + lVar7) << iVar8;
        auVar14._4_4_ = *(undefined4 *)((long)&local_438 + lVar7 + 4);
        auVar14._8_4_ = *(undefined4 *)((long)&uStack_430 + lVar7);
        auVar14._12_4_ = *(undefined4 *)((long)&uStack_430 + lVar7 + 4);
        auVar13 = pmulld(auVar14,auVar17);
        *(int *)((long)&local_438 + lVar7) = auVar13._0_4_ + auVar18._0_4_ >> 0xc;
        *(int *)((long)&local_438 + lVar7 + 4) = auVar13._4_4_ + auVar18._4_4_ >> 0xc;
        *(int *)((long)&uStack_430 + lVar7) = auVar13._8_4_ + auVar18._8_4_ >> 0xc;
        *(int *)((long)&uStack_430 + lVar7 + 4) = auVar13._12_4_ + auVar18._12_4_ >> 0xc;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x100);
    }
    *(undefined8 *)(coeff + lVar11 * 8) = local_438;
    *(undefined8 *)(coeff + lVar11 * 8 + 2) = uStack_430;
    *(undefined8 *)(coeff + lVar11 * 8 + 4) = local_428;
    *(undefined8 *)(coeff + lVar11 * 8 + 4 + 2) = uStack_420;
    *(undefined8 *)(coeff + lVar11 * 8 + 0x10) = local_418;
    *(ulong *)(coeff + lVar11 * 8 + 0x10 + 2) = CONCAT44(iStack_40c,iStack_410);
    *(ulong *)(coeff + lVar11 * 8 + 0x14) = CONCAT44(iStack_404,local_408);
    *(ulong *)(coeff + lVar11 * 8 + 0x14 + 2) = CONCAT44(iStack_3fc,iStack_400);
    *(ulong *)(coeff + lVar11 * 8 + 0x20) = CONCAT44(iStack_3f4,local_3f8);
    *(ulong *)(coeff + lVar11 * 8 + 0x20 + 2) = CONCAT44(iStack_3ec,iStack_3f0);
    *(ulong *)(coeff + lVar11 * 8 + 0x24) = CONCAT44(iStack_3e4,local_3e8);
    *(ulong *)(coeff + lVar11 * 8 + 0x24 + 2) = CONCAT44(iStack_3dc,iStack_3e0);
    *(undefined8 *)(coeff + lVar11 * 8 + 0x30) = local_3d8;
    *(ulong *)(coeff + lVar11 * 8 + 0x30 + 2) = CONCAT44(iStack_3cc,iStack_3d0);
    *(ulong *)(coeff + lVar11 * 8 + 0x34) = CONCAT44(iStack_3c4,local_3c8);
    *(ulong *)(coeff + lVar11 * 8 + 0x34 + 2) = CONCAT44(iStack_3bc,iStack_3c0);
    *(undefined8 *)(coeff + lVar11 * 8 + 0x40) = local_3b8;
    *(undefined8 *)(coeff + lVar11 * 8 + 0x40 + 2) = uStack_3b0;
    *(undefined8 *)(coeff + lVar11 * 8 + 0x44) = local_3a8;
    *(undefined8 *)(coeff + lVar11 * 8 + 0x44 + 2) = uStack_3a0;
    *(undefined8 *)(coeff + lVar11 * 8 + 0x50) = local_398;
    *(ulong *)(coeff + lVar11 * 8 + 0x50 + 2) = CONCAT44(iStack_38c,iStack_390);
    *(ulong *)(coeff + lVar11 * 8 + 0x54) = CONCAT44(iStack_384,local_388);
    *(ulong *)(coeff + lVar11 * 8 + 0x54 + 2) = CONCAT44(iStack_37c,iStack_380);
    *(ulong *)(coeff + lVar11 * 8 + 0x60) = CONCAT44(iStack_374,local_378);
    *(ulong *)(coeff + lVar11 * 8 + 0x60 + 2) = CONCAT44(iStack_36c,iStack_370);
    *(ulong *)(coeff + lVar11 * 8 + 100) = CONCAT44(iStack_364,local_368);
    *(ulong *)(coeff + lVar11 * 8 + 100 + 2) = CONCAT44(iStack_35c,iStack_360);
    *(undefined8 *)(coeff + lVar11 * 8 + 0x70) = local_358;
    *(ulong *)(coeff + lVar11 * 8 + 0x70 + 2) = CONCAT44(iStack_34c,iStack_350);
    *(ulong *)(coeff + lVar11 * 8 + 0x74) = CONCAT44(iStack_344,local_348);
    *(ulong *)(coeff + lVar11 * 8 + 0x74 + 2) = CONCAT44(iStack_33c,iStack_340);
    lVar11 = 1;
    bVar5 = false;
  } while (bVar12);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bit, 2);
  col_txfm_8x16_rounding(in, -shift[1]);
  transpose_8x8(in, out);
  transpose_8x8(in + 16, out + 16);

  for (int i = 0; i < 2; i++) {
    row_txfm(out + i * 16, out, bit, 2);
    av1_round_shift_rect_array_32_sse4_1(out, out, 16, -shift[2], NewSqrt2);
    write_buffer_16x8(out, coeff + i * 8, 16);
  }
  (void)bd;
}